

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONPackagePresets.cxx
# Opt level: O0

ReadFileResult
cmCMakePresetsGraphInternal::PackagePresetsHelper
          (vector<cmCMakePresetsGraph::PackagePreset,_std::allocator<cmCMakePresetsGraph::PackagePreset>_>
           *out,Value *value)

{
  int iVar1;
  ReadFileResult RVar2;
  Object<cmCMakePresetsGraph::PackagePreset> *in_R8;
  Object<cmCMakePresetsGraph::PackagePreset> local_40;
  Value *local_18;
  Value *value_local;
  vector<cmCMakePresetsGraph::PackagePreset,_std::allocator<cmCMakePresetsGraph::PackagePreset>_>
  *out_local;
  
  local_18 = value;
  value_local = (Value *)out;
  if (PackagePresetsHelper(std::vector<cmCMakePresetsGraph::PackagePreset,std::allocator<cmCMakePresetsGraph::PackagePreset>>&,Json::Value_const*)
      ::helper == '\0') {
    iVar1 = __cxa_guard_acquire(&PackagePresetsHelper(std::vector<cmCMakePresetsGraph::PackagePreset,std::allocator<cmCMakePresetsGraph::PackagePreset>>&,Json::Value_const*)
                                 ::helper);
    if (iVar1 != 0) {
      cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
      Object<cmCMakePresetsGraph::PackagePreset>::Object
                (&local_40,
                 (Object<cmCMakePresetsGraph::PackagePreset> *)
                 (anonymous_namespace)::PackagePresetHelper);
      cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
      Vector<cmCMakePresetsGraph::PackagePreset,cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::PackagePreset>>
                (&PackagePresetsHelper::helper,
                 (cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult> *)0x0,INVALID_PRESETS,
                 (ReadFileResult)&local_40,in_R8);
      cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
      Object<cmCMakePresetsGraph::PackagePreset>::~Object(&local_40);
      __cxa_atexit(std::
                   function<cmCMakePresetsGraph::ReadFileResult_(std::vector<cmCMakePresetsGraph::PackagePreset,_std::allocator<cmCMakePresetsGraph::PackagePreset>_>_&,_const_Json::Value_*)>
                   ::~function,&PackagePresetsHelper::helper,&__dso_handle);
      __cxa_guard_release(&PackagePresetsHelper(std::vector<cmCMakePresetsGraph::PackagePreset,std::allocator<cmCMakePresetsGraph::PackagePreset>>&,Json::Value_const*)
                           ::helper);
    }
  }
  RVar2 = std::
          function<cmCMakePresetsGraph::ReadFileResult_(std::vector<cmCMakePresetsGraph::PackagePreset,_std::allocator<cmCMakePresetsGraph::PackagePreset>_>_&,_const_Json::Value_*)>
          ::operator()(&PackagePresetsHelper::helper,
                       (vector<cmCMakePresetsGraph::PackagePreset,_std::allocator<cmCMakePresetsGraph::PackagePreset>_>
                        *)value_local,local_18);
  return RVar2;
}

Assistant:

cmCMakePresetsGraph::ReadFileResult PackagePresetsHelper(
  std::vector<cmCMakePresetsGraph::PackagePreset>& out,
  const Json::Value* value)
{
  static auto const helper =
    cmJSONHelperBuilder<ReadFileResult>::Vector<PackagePreset>(
      ReadFileResult::READ_OK, ReadFileResult::INVALID_PRESETS,
      PackagePresetHelper);

  return helper(out, value);
}